

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

void NULLCTypeInfo::SetFunctionContext(NULLCRef obj,NULLCRef context)

{
  ExternTypeInfo *pEVar1;
  ExternFuncInfo *pEVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  FastVector<char,_false,_false> *pFVar6;
  uint in_stack_00000008;
  undefined8 *in_stack_0000000c;
  uint in_stack_00000018;
  undefined8 in_stack_0000001c;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x17b,"void NULLCTypeInfo::SetFunctionContext(NULLCRef, NULLCRef)");
  }
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),in_stack_00000008
                     );
  if (pEVar1->subCat == CAT_FUNCTION) {
    pEVar2 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       ((FastVector<ExternFuncInfo,_false,_false> *)(linker + 0x240),
                        *(uint *)(in_stack_0000000c + 1));
    if (pEVar2->contextType != 0xffffffff) {
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                          pEVar2->contextType);
      if ((pEVar1->field_11).subType == in_stack_00000018) {
        *in_stack_0000000c = in_stack_0000001c;
        return;
      }
      pFVar6 = (FastVector<char,_false,_false> *)(linker + 0x290);
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                          in_stack_00000018);
      pcVar3 = FastVector<char,_false,_false>::operator[](pFVar6,pEVar1->offsetToName);
      pcVar4 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar2->offsetToName);
      pFVar6 = (FastVector<char,_false,_false> *)(linker + 0x290);
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                          pEVar2->contextType);
      pcVar5 = FastVector<char,_false,_false>::operator[](pFVar6,pEVar1->offsetToName);
      nullcThrowError("functionSetContext: cannot set context of type \'%s\' to the function \'%s\' expecting context of type \'%s\'"
                      ,pcVar3,pcVar4,pcVar5);
      return;
    }
    pcVar3 = FastVector<char,_false,_false>::operator[]
                       ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar2->offsetToName);
    pcVar4 = "functionSetContext: function \'%s\' doesn\'t have a context";
  }
  else {
    pcVar3 = FastVector<char,_false,_false>::operator[]
                       ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
    pcVar4 = "functionSetContext: received type \'%s\' that is not a function";
  }
  nullcThrowError(pcVar4,pcVar3);
  return;
}

Assistant:

void SetFunctionContext(NULLCRef obj, NULLCRef context)
	{
		assert(linker);

		ExternTypeInfo &objectType = linker->exTypes[obj.typeID];

		if(objectType.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("functionSetContext: received type '%s' that is not a function", &linker->exSymbols[objectType.offsetToName]);
			return;
		}

		NULLCFuncPtr *ptr = (NULLCFuncPtr*)obj.ptr;

		ExternFuncInfo &function = linker->exFunctions[ptr->id];

		if(function.contextType == ~0u)
		{
			nullcThrowError("functionSetContext: function '%s' doesn't have a context", &linker->exSymbols[function.offsetToName]);
			return;
		}

		ExternTypeInfo &contextRefType = linker->exTypes[function.contextType];

		if(contextRefType.subType != context.typeID)
		{
			nullcThrowError("functionSetContext: cannot set context of type '%s' to the function '%s' expecting context of type '%s'", &linker->exSymbols[linker->exTypes[context.typeID].offsetToName], &linker->exSymbols[function.offsetToName], &linker->exSymbols[linker->exTypes[function.contextType].offsetToName]);
			return;
		}

		ptr->context = context.ptr;
	}